

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_avx2_256_16.c
# Opt level: O0

parasail_result_t *
parasail_sw_table_scan_profile_avx2_256_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  int iVar1;
  long lVar2;
  long lVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  short sVar12;
  __m256i a;
  __m256i alVar13;
  __m256i c;
  __m256i vH_00;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  int iVar23;
  int iVar24;
  __m256i *ptr;
  __m256i *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  __m256i *palVar25;
  uint in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  int32_t temp;
  int32_t column_len;
  int16_t *t;
  __m256i vCompare;
  __m256i vFt;
  __m256i vW;
  __m256i *pvW;
  __m256i vHp;
  __m256i vH;
  __m256i vF;
  __m256i vHt;
  __m256i vE;
  __m256i vGapper;
  parasail_result_t *result;
  __m256i vSegLenXgap;
  __m256i vNegInfFront;
  __m256i vMaxHUnit;
  __m256i vMaxH;
  __m256i vSaturationCheckMax;
  __m256i vSaturationCheckMin;
  __m256i vPosLimit;
  __m256i vNegLimit;
  int16_t score;
  __m256i vZero;
  int16_t POS_LIMIT;
  int16_t NEG_LIMIT;
  __m256i vGapE;
  __m256i vGapO;
  __m256i *pvGapper;
  __m256i *pvHMax;
  __m256i *pvH;
  __m256i *pvHt;
  __m256i *pvE;
  __m256i *pvP;
  int32_t segLen;
  int32_t segWidth;
  parasail_matrix_t *matrix;
  int32_t s1Len;
  int32_t end_ref;
  int32_t end_query;
  int32_t j;
  int32_t i;
  undefined8 in_stack_fffffffffffff120;
  int32_t in_stack_fffffffffffff128;
  int32_t in_stack_fffffffffffff12c;
  int32_t in_stack_fffffffffffff130;
  int32_t in_stack_fffffffffffff134;
  undefined4 in_stack_fffffffffffff138;
  ushort in_stack_fffffffffffff13c;
  ushort uVar31;
  undefined4 in_stack_fffffffffffff150;
  undefined4 in_stack_fffffffffffff154;
  __m256i *local_ea8;
  undefined1 local_ea0 [32];
  long lStack_e88;
  __m256i local_e20;
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [32];
  longlong local_da0;
  longlong lStack_d98;
  longlong lStack_d90;
  longlong lStack_d88;
  undefined1 local_d80 [32];
  undefined1 local_d20 [32];
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  ushort local_c22;
  int local_b44;
  int local_b40;
  int local_b3c;
  int local_b38;
  ushort local_b34;
  ushort local_b30;
  parasail_result_t *local_b18;
  ulong uStack_af8;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  
  if (in_RDI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_16","profile");
    local_b18 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x30) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_16",
            "profile->profile16.score");
    local_b18 = (parasail_result_t *)0x0;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_16",
            "profile->matrix");
    local_b18 = (parasail_result_t *)0x0;
  }
  else if (*(int *)(in_RDI + 8) < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_avx2_256_16",
            "profile->s1Len");
    local_b18 = (parasail_result_t *)0x0;
  }
  else if (in_RSI == 0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_sw_table_scan_profile_avx2_256_16","s2");
    local_b18 = (parasail_result_t *)0x0;
  }
  else if (in_EDX < 1) {
    fprintf(_stderr,"%s: %s must be > 0\n","parasail_sw_table_scan_profile_avx2_256_16","s2Len");
    local_b18 = (parasail_result_t *)0x0;
  }
  else if ((int)in_ECX < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_avx2_256_16","open");
    local_b18 = (parasail_result_t *)0x0;
  }
  else if ((int)in_R8D < 0) {
    fprintf(_stderr,"%s: %s must be >= 0\n","parasail_sw_table_scan_profile_avx2_256_16","gap");
    local_b18 = (parasail_result_t *)0x0;
  }
  else {
    local_b44 = 0;
    local_b40 = *(int *)(in_RDI + 8);
    lVar2 = *(long *)(in_RDI + 0x10);
    iVar23 = (local_b40 + 0xf) / 0x10;
    lVar3 = *(long *)(in_RDI + 0x30);
    local_b30 = (ushort)in_ECX;
    auVar5 = vpinsrw_avx(ZEXT216(local_b30),in_ECX & 0xffff,1);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,2);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,3);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,4);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,5);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,6);
    auVar5 = vpinsrw_avx(auVar5,in_ECX & 0xffff,7);
    auVar28 = vpinsrw_avx(ZEXT216(local_b30),in_ECX & 0xffff,1);
    auVar28 = vpinsrw_avx(auVar28,in_ECX & 0xffff,2);
    auVar28 = vpinsrw_avx(auVar28,in_ECX & 0xffff,3);
    auVar28 = vpinsrw_avx(auVar28,in_ECX & 0xffff,4);
    auVar28 = vpinsrw_avx(auVar28,in_ECX & 0xffff,5);
    auVar28 = vpinsrw_avx(auVar28,in_ECX & 0xffff,6);
    auVar28 = vpinsrw_avx(auVar28,in_ECX & 0xffff,7);
    uStack_230 = auVar28._0_8_;
    uStack_228 = auVar28._8_8_;
    local_b34 = (ushort)in_R8D;
    auVar28 = vpinsrw_avx(ZEXT216(local_b34),in_R8D & 0xffff,1);
    auVar28 = vpinsrw_avx(auVar28,in_R8D & 0xffff,2);
    auVar28 = vpinsrw_avx(auVar28,in_R8D & 0xffff,3);
    auVar28 = vpinsrw_avx(auVar28,in_R8D & 0xffff,4);
    auVar28 = vpinsrw_avx(auVar28,in_R8D & 0xffff,5);
    auVar28 = vpinsrw_avx(auVar28,in_R8D & 0xffff,6);
    auVar28 = vpinsrw_avx(auVar28,in_R8D & 0xffff,7);
    auVar26 = vpinsrw_avx(ZEXT216(local_b34),in_R8D & 0xffff,1);
    auVar26 = vpinsrw_avx(auVar26,in_R8D & 0xffff,2);
    auVar26 = vpinsrw_avx(auVar26,in_R8D & 0xffff,3);
    auVar26 = vpinsrw_avx(auVar26,in_R8D & 0xffff,4);
    auVar26 = vpinsrw_avx(auVar26,in_R8D & 0xffff,5);
    auVar26 = vpinsrw_avx(auVar26,in_R8D & 0xffff,6);
    auVar26 = vpinsrw_avx(auVar26,in_R8D & 0xffff,7);
    auVar26 = ZEXT116(0) * auVar28 + ZEXT116(1) * auVar26;
    auVar28 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar28;
    uStack_1f0 = auVar28._0_8_;
    uStack_1e8 = auVar28._8_8_;
    if ((int)-in_ECX < *(int *)(lVar2 + 0x20)) {
      iVar24 = in_ECX - 0x8000;
    }
    else {
      iVar24 = -0x8000 - *(int *)(lVar2 + 0x20);
    }
    local_c22 = (short)iVar24 + 1;
    uVar19 = ((ushort)*(undefined4 *)(lVar2 + 0x1c) ^ 0x7fff) - 1;
    uStack_af8 = SUB328(ZEXT832(0),4);
    auVar28 = vpinsrw_avx(ZEXT216(local_c22),(uint)local_c22,1);
    auVar28 = vpinsrw_avx(auVar28,(uint)local_c22,2);
    auVar28 = vpinsrw_avx(auVar28,(uint)local_c22,3);
    auVar28 = vpinsrw_avx(auVar28,(uint)local_c22,4);
    auVar28 = vpinsrw_avx(auVar28,(uint)local_c22,5);
    auVar28 = vpinsrw_avx(auVar28,(uint)local_c22,6);
    auVar28 = vpinsrw_avx(auVar28,(uint)local_c22,7);
    auVar29 = vpinsrw_avx(ZEXT216(local_c22),(uint)local_c22,1);
    auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,2);
    auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,3);
    auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,4);
    auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,5);
    auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,6);
    auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,7);
    uStack_1b0 = auVar29._0_8_;
    uStack_1a8 = auVar29._8_8_;
    auVar6 = vpinsrw_avx(ZEXT216(uVar19),(uint)uVar19,1);
    auVar6 = vpinsrw_avx(auVar6,(uint)uVar19,2);
    auVar6 = vpinsrw_avx(auVar6,(uint)uVar19,3);
    auVar6 = vpinsrw_avx(auVar6,(uint)uVar19,4);
    auVar6 = vpinsrw_avx(auVar6,(uint)uVar19,5);
    auVar6 = vpinsrw_avx(auVar6,(uint)uVar19,6);
    auVar6 = vpinsrw_avx(auVar6,(uint)uVar19,7);
    auVar27 = vpinsrw_avx(ZEXT216(uVar19),(uint)uVar19,1);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar19,2);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar19,3);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar19,4);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar19,5);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar19,6);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar19,7);
    uStack_170 = auVar27._0_8_;
    uStack_168 = auVar27._8_8_;
    local_ca0._16_8_ = uStack_170;
    local_ca0._0_16_ = auVar6;
    local_ca0._24_8_ = uStack_168;
    local_cc0._16_8_ = uStack_1b0;
    local_cc0._0_16_ = auVar28;
    local_cc0._24_8_ = uStack_1a8;
    local_ce0._16_8_ = uStack_1b0;
    local_ce0._0_16_ = auVar28;
    local_ce0._24_8_ = uStack_1a8;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = uStack_af8;
    local_d20._0_16_ = auVar27 << 0x40;
    auVar27 = local_d20._0_16_;
    local_d20 = ZEXT832(uStack_af8) << 0x40;
    auVar27 = vpinsrw_avx(auVar27,(uint)local_c22,0);
    auVar4 = vblendps_avx(local_d20,ZEXT1632(auVar27),0xf);
    sVar12 = (short)iVar23;
    uVar20 = -sVar12 * local_b34;
    auVar27 = vpinsrw_avx(ZEXT216(uVar20),(uint)uVar20,1);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar20,2);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar20,3);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar20,4);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar20,5);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar20,6);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar20,7);
    auVar7 = vpinsrw_avx(ZEXT216(uVar20),(uint)uVar20,1);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar20,2);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar20,3);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar20,4);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar20,5);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar20,6);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar20,7);
    auVar11._16_16_ = auVar7;
    auVar11._0_16_ = auVar27;
    uVar21 = -sVar12 * local_b34;
    auVar27 = vpinsrw_avx(ZEXT216(uVar21),(uint)uVar21,1);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar21,2);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar21,3);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar21,4);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar21,5);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar21,6);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar21,7);
    auVar7 = vpinsrw_avx(ZEXT216(uVar21),(uint)uVar21,1);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar21,2);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar21,3);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar21,4);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar21,5);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar21,6);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar21,7);
    auVar10._16_16_ = auVar7;
    auVar10._0_16_ = auVar27;
    uVar22 = -sVar12 * local_b34;
    auVar27 = vpinsrw_avx(ZEXT216(uVar22),(uint)uVar22,1);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar22,2);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar22,3);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar22,4);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar22,5);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar22,6);
    auVar27 = vpinsrw_avx(auVar27,(uint)uVar22,7);
    auVar7 = vpinsrw_avx(ZEXT216(uVar22),(uint)uVar22,1);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar22,2);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar22,3);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar22,4);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar22,5);
    auVar7 = vpinsrw_avx(auVar7,(uint)uVar22,6);
    vpinsrw_avx(auVar7,(uint)uVar22,7);
    auVar10 = vperm2i128_avx2(ZEXT1632(auVar27),auVar10,0x28);
    auVar10 = vpalignr_avx2(auVar11,auVar10,0xe);
    auVar10 = vpaddsw_avx2(auVar4,auVar10);
    uVar31 = local_c22;
    local_b18 = parasail_result_new_table1(iVar23 * 0x10,in_EDX);
    if (local_b18 == (parasail_result_t *)0x0) {
      local_b18 = (parasail_result_t *)0x0;
    }
    else {
      local_b18->flag = local_b18->flag | 0x10200404;
      local_b18->flag = local_b18->flag | 0x20000;
      ptr = parasail_memalign___m256i(0x20,(long)iVar23);
      ptr_00 = parasail_memalign___m256i(0x20,(long)iVar23);
      ptr_01 = parasail_memalign___m256i(0x20,(long)iVar23);
      ptr_02 = parasail_memalign___m256i(0x20,(long)iVar23);
      ptr_03 = parasail_memalign___m256i(0x20,(long)iVar23);
      if (ptr == (__m256i *)0x0) {
        local_b18 = (parasail_result_t *)0x0;
      }
      else if (ptr_00 == (__m256i *)0x0) {
        local_b18 = (parasail_result_t *)0x0;
      }
      else if (ptr_01 == (__m256i *)0x0) {
        local_b18 = (parasail_result_t *)0x0;
      }
      else if (ptr_02 == (__m256i *)0x0) {
        local_b18 = (parasail_result_t *)0x0;
      }
      else if (ptr_03 == (__m256i *)0x0) {
        local_b18 = (parasail_result_t *)0x0;
      }
      else {
        alVar13[0]._4_2_ = in_stack_fffffffffffff13c;
        alVar13[0]._0_4_ = in_stack_fffffffffffff138;
        alVar13[0]._6_2_ = uVar31;
        alVar13[1]._0_2_ = uVar19;
        alVar13[1]._2_2_ = uVar20;
        alVar13[1]._4_2_ = uVar21;
        alVar13[1]._6_2_ = uVar22;
        alVar13[2]._0_4_ = iVar24;
        alVar13[2]._4_2_ = local_b30;
        alVar13[2]._6_2_ = local_b34;
        alVar13[3]._0_4_ = in_stack_fffffffffffff150;
        alVar13[3]._4_4_ = in_stack_fffffffffffff154;
        parasail_memset___m256i
                  (local_ea0._16_8_,alVar13,
                   CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130));
        c[0]._4_2_ = in_stack_fffffffffffff13c;
        c[0]._0_4_ = in_stack_fffffffffffff138;
        c[0]._6_2_ = uVar31;
        c[1]._0_2_ = uVar19;
        c[1]._2_2_ = uVar20;
        c[1]._4_2_ = uVar21;
        c[1]._6_2_ = uVar22;
        c[2]._0_4_ = iVar24;
        c[2]._4_2_ = local_b30;
        c[2]._6_2_ = local_b34;
        c[3]._0_4_ = in_stack_fffffffffffff150;
        c[3]._4_4_ = in_stack_fffffffffffff154;
        parasail_memset___m256i
                  (local_ea0._16_8_,c,CONCAT44(in_stack_fffffffffffff134,in_stack_fffffffffffff130))
        ;
        auVar9._16_8_ = uStack_230;
        auVar9._0_16_ = auVar5;
        auVar9._24_8_ = uStack_228;
        local_d80 = vpsubsw_avx2(ZEXT832(uStack_af8) << 0x40,auVar9);
        local_b38 = iVar23;
        while( true ) {
          local_b38 = local_b38 + -1;
          auVar30 = ZEXT3264(auVar9);
          if (local_b38 < 0) break;
          palVar25 = ptr_03 + local_b38;
          (*palVar25)[0] = local_d80._0_8_;
          (*palVar25)[1] = local_d80._8_8_;
          (*palVar25)[2] = local_d80._16_8_;
          (*palVar25)[3] = local_d80._24_8_;
          auVar9._16_8_ = uStack_1f0;
          auVar9._0_16_ = auVar26;
          auVar9._24_8_ = uStack_1e8;
          local_d80 = vpsubsw_avx2(local_d80,auVar9);
        }
        local_b3c = 0;
        auVar27 = auVar28;
        while( true ) {
          uStack_ce8 = auVar29._8_8_;
          uStack_cf0 = auVar29._0_8_;
          if (in_EDX <= local_b3c) break;
          auVar11 = vperm2i128_avx2(auVar30._0_32_,(undefined1  [32])ptr_01[iVar23 + -1],0x28);
          local_e20 = (__m256i)vpalignr_avx2((undefined1  [32])ptr_01[iVar23 + -1],auVar11,0xe);
          iVar1 = *(int *)(*(long *)(lVar2 + 0x10) + (ulong)*(byte *)(in_RSI + local_b3c) * 4);
          local_dc0 = ZEXT832(uStack_af8) << 0x40;
          local_de0._16_8_ = uStack_1b0;
          local_de0._0_16_ = auVar28;
          local_de0._24_8_ = uStack_1a8;
          for (local_b38 = 0; local_b38 < iVar23; local_b38 = local_b38 + 1) {
            alVar13 = ptr_01[local_b38];
            auVar16._16_8_ = uStack_1f0;
            auVar16._0_16_ = auVar26;
            auVar16._24_8_ = uStack_1e8;
            auVar11 = vpsubsw_avx2((undefined1  [32])ptr[local_b38],auVar16);
            auVar8._16_8_ = uStack_230;
            auVar8._0_16_ = auVar5;
            auVar8._24_8_ = uStack_228;
            auVar9 = vpsubsw_avx2((undefined1  [32])ptr_01[local_b38],auVar8);
            auVar8 = vpmaxsw_avx2(auVar11,auVar9);
            auVar11 = vpaddsw_avx2((undefined1  [32])local_e20,
                                   *(undefined1 (*) [32])
                                    (lVar3 + (long)(iVar1 * iVar23) * 0x20 + (long)local_b38 * 0x20)
                                  );
            auVar9 = vpaddsw_avx2(local_dc0,(undefined1  [32])ptr_03[local_b38]);
            local_de0 = vpmaxsw_avx2(local_de0,auVar9);
            local_da0 = auVar8._0_8_;
            lStack_d98 = auVar8._8_8_;
            lStack_d90 = auVar8._16_8_;
            lStack_d88 = auVar8._24_8_;
            local_dc0 = vpmaxsw_avx2(auVar8,auVar11);
            palVar25 = ptr + local_b38;
            (*palVar25)[0] = local_da0;
            (*palVar25)[1] = lStack_d98;
            (*palVar25)[2] = lStack_d90;
            (*palVar25)[3] = lStack_d88;
            palVar25 = ptr_00 + local_b38;
            (*palVar25)[0] = local_dc0._0_8_;
            (*palVar25)[1] = local_dc0._8_8_;
            (*palVar25)[2] = local_dc0._16_8_;
            (*palVar25)[3] = local_dc0._24_8_;
            local_e20 = alVar13;
          }
          auVar11 = vperm2i128_avx2(auVar11,local_dc0,0x28);
          auVar9 = vpalignr_avx2(local_dc0,auVar11,0xe);
          auVar11 = vpaddsw_avx2(auVar9,(undefined1  [32])*ptr_03);
          local_de0 = vpmaxsw_avx2(local_de0,auVar11);
          for (local_b38 = 0; local_b38 < 0xe; local_b38 = local_b38 + 1) {
            auVar11 = vperm2i128_avx2(auVar11,local_de0,0x28);
            auVar11 = vpalignr_avx2(local_de0,auVar11,0xe);
            auVar11 = vpaddsw_avx2(auVar11,auVar10);
            local_de0 = vpmaxsw_avx2(local_de0,auVar11);
          }
          auVar11 = vperm2i128_avx2(auVar11,local_de0,0x28);
          auVar11 = vpalignr_avx2(local_de0,auVar11,0xe);
          local_de0 = vpaddsw_avx2(auVar11,auVar4);
          auVar11 = vpmaxsw_avx2(auVar9,local_de0);
          local_e00 = vpmaxsw_avx2(auVar11,ZEXT832(uStack_af8) << 0x40);
          for (local_b38 = 0; local_b38 < iVar23; local_b38 = local_b38 + 1) {
            auVar15._16_8_ = uStack_1f0;
            auVar15._0_16_ = auVar26;
            auVar15._24_8_ = uStack_1e8;
            auVar11 = vpsubsw_avx2(local_de0,auVar15);
            auVar14._16_8_ = uStack_230;
            auVar14._0_16_ = auVar5;
            auVar14._24_8_ = uStack_228;
            auVar9 = vpsubsw_avx2(local_e00,auVar14);
            local_de0 = vpmaxsw_avx2(auVar11,auVar9);
            auVar11 = vpmaxsw_avx2((undefined1  [32])ptr_00[local_b38],local_de0);
            local_e00 = vpmaxsw_avx2(auVar11,ZEXT832(uStack_af8) << 0x40);
            palVar25 = ptr_01 + local_b38;
            (*palVar25)[0] = local_e00._0_8_;
            (*palVar25)[1] = local_e00._8_8_;
            (*palVar25)[2] = local_e00._16_8_;
            (*palVar25)[3] = local_e00._24_8_;
            local_ca0 = vpminsw_avx2(local_ca0,local_e00);
            local_cc0 = vpmaxsw_avx2(local_cc0,local_e00);
            vH_00[0]._4_2_ = in_stack_fffffffffffff13c;
            vH_00[0]._0_4_ = in_stack_fffffffffffff138;
            vH_00[0]._6_2_ = uVar31;
            vH_00[1]._0_2_ = uVar19;
            vH_00[1]._2_2_ = uVar20;
            vH_00[1]._4_2_ = uVar21;
            vH_00[1]._6_2_ = uVar22;
            vH_00[2]._0_4_ = iVar24;
            vH_00[2]._4_2_ = local_b30;
            vH_00[2]._6_2_ = local_b34;
            vH_00[3]._0_4_ = in_stack_fffffffffffff150;
            vH_00[3]._4_4_ = in_stack_fffffffffffff154;
            arr_store_si256(local_ea0._0_8_,vH_00,in_stack_fffffffffffff134,
                            in_stack_fffffffffffff130,in_stack_fffffffffffff12c,
                            in_stack_fffffffffffff128);
            local_ce0 = vpmaxsw_avx2(local_e00,local_ce0);
          }
          auVar18._16_8_ = uStack_cf0;
          auVar18._0_16_ = auVar27;
          auVar18._24_8_ = uStack_ce8;
          auVar30 = ZEXT3264(auVar18);
          local_ea0 = vpcmpgtw_avx2(local_ce0,auVar18);
          if ((((((((((((((((((((((((((((((((local_ea0 >> 7 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0 ||
                                           (local_ea0 >> 0xf & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (local_ea0 >> 0x17 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (local_ea0 >> 0x1f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (local_ea0 >> 0x27 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (local_ea0 >> 0x2f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (local_ea0 >> 0x37 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (local_ea0 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (local_ea0 >> 0x47 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (local_ea0 >> 0x4f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (local_ea0 >> 0x57 & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                                 (local_ea0 >> 0x5f & (undefined1  [32])0x1) !=
                                 (undefined1  [32])0x0) ||
                                (local_ea0 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (local_ea0 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (local_ea0 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(local_ea0 >> 0x7f,0) != '\0') ||
                            (local_ea0 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           (local_ea0 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (local_ea0 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (local_ea0 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (local_ea0 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (local_ea0 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (local_ea0 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(local_ea0 >> 0xbf,0) != '\0') ||
                    (local_ea0 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_ea0 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_ea0 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (local_ea0 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_ea0 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (local_ea0 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (local_ea0 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              lStack_e88 < 0) {
            a[1] = in_stack_fffffffffffff120;
            a[0] = 0xc9c7b4;
            a[2]._0_4_ = in_stack_fffffffffffff128;
            a[2]._4_4_ = in_stack_fffffffffffff12c;
            a[3]._0_4_ = in_stack_fffffffffffff130;
            a[3]._4_4_ = in_stack_fffffffffffff134;
            local_c22 = _mm256_hmax_epi16_rpl(a);
            auVar29 = vpinsrw_avx(ZEXT216(local_c22),(uint)local_c22,1);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,2);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,3);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,4);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,5);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,6);
            auVar7 = vpinsrw_avx(auVar29,(uint)local_c22,7);
            auVar29 = vpinsrw_avx(ZEXT216(local_c22),(uint)local_c22,1);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,2);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,3);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,4);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,5);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,6);
            auVar29 = vpinsrw_avx(auVar29,(uint)local_c22,7);
            auVar27 = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar29;
            auVar29 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
            local_b44 = local_b3c;
            auVar30 = ZEXT1664(auVar7);
            in_stack_fffffffffffff13c = local_c22;
            memcpy(ptr_02,ptr_01,(long)iVar23 << 5);
          }
          local_b3c = local_b3c + 1;
        }
        local_ea8 = ptr_02;
        for (local_b38 = 0; local_b38 < iVar23 * 0x10; local_b38 = local_b38 + 1) {
          if (((ushort)(*local_ea8)[0] == local_c22) &&
             (iVar24 = local_b38 / 0x10 + (local_b38 % 0x10) * iVar23, iVar24 < local_b40)) {
            local_b40 = iVar24;
          }
          local_ea8 = (__m256i *)((long)*local_ea8 + 2);
        }
        auVar4._16_8_ = uStack_1b0;
        auVar4._0_16_ = auVar28;
        auVar4._24_8_ = uStack_1a8;
        auVar4 = vpcmpgtw_avx2(auVar4,local_ca0);
        auVar17._16_8_ = uStack_170;
        auVar17._0_16_ = auVar6;
        auVar17._24_8_ = uStack_168;
        auVar10 = vpcmpgtw_avx2(local_cc0,auVar17);
        auVar4 = vpor_avx2(auVar4,auVar10);
        if ((((((((((((((((((((((((((((((((auVar4 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar4 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar4 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar4 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar4 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar4 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar4 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar4 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                   ) || (auVar4 >> 0x47 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                 (auVar4 >> 0x4f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                                || (auVar4 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                ) || (auVar4 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                              (auVar4 >> 0x67 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar4 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar4 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar4 >> 0x7f,0) != '\0') ||
                          (auVar4 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar4 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar4 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar4 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar4 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar4 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar4 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar4 >> 0xbf,0) != '\0') ||
                  (auVar4 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar4 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar4 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar4 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar4 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar4 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar4 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar4[0x1f] < '\0') {
          local_b18->flag = local_b18->flag | 0x40;
          local_c22 = 0;
          local_b40 = 0;
          local_b44 = 0;
        }
        local_b18->score = (int)(short)local_c22;
        local_b18->end_query = local_b40;
        local_b18->end_ref = local_b44;
        parasail_free(ptr_03);
        parasail_free(ptr_02);
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
      }
    }
  }
  return local_b18;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m256i vZero;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m256i*)profile->profile16.score;
    vGapO = _mm256_set1_epi16(open);
    vGapE = _mm256_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi16_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_adds_epi16(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    {
        __m256i vGapper = _mm256_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vE, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vHp = _mm256_adds_epi16(vHp, vW);
            vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm256_max_epi16(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 2);
        vF = _mm256_max_epi16(vF, _mm256_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 2);
            vFt = _mm256_adds_epi16(vFt, vSegLenXgap);
            vF = _mm256_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 2);
        vF = _mm256_adds_epi16(vF, vNegInfFront);
        vH = _mm256_max_epi16(vHt, vF);
        vH = _mm256_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vF, vGapE),
                    _mm256_subs_epi16(vH, vGapO));
            vH = _mm256_max_epi16(vHt, vF);
            vH = _mm256_max_epi16(vH, vZero);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi16(vH, vMaxH);
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm256_extract_epi16_rpl (vH, 15);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}